

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *
GEO::InstanceRepo::instance<GEO::Factory<GEO::FactoryCreator1<GEO::Delaunay,unsigned_char>>>(void)

{
  Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *instance;
  _Rb_tree_header *p_Var1;
  allocator local_29;
  string name;
  
  std::__cxx11::string::string
            ((string *)&name,"N3GEO7FactoryINS_15FactoryCreator1INS_8DelaunayEhEEEE",&local_29);
  instance = (Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)get(&name);
  if (instance == (Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)0x0) {
    instance = (Factory<GEO::FactoryCreator1<GEO::Delaunay,_unsigned_char>_> *)operator_new(0x40);
    (instance->super_Instance).nb_refs_ = 0;
    (instance->super_Instance)._vptr_Counted = (_func_int **)&PTR__Factory_001aeaf8;
    p_Var1 = &(instance->registry_)._M_t._M_impl.super__Rb_tree_header;
    (instance->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (instance->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (instance->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (instance->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
    ;
    (instance->registry_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    add(&name,(Instance *)instance);
  }
  std::__cxx11::string::~string((string *)&name);
  return instance;
}

Assistant:

static InstanceType& instance() {
            const std::string name = typeid(InstanceType).name();
            Instance* instance = get(name);
            if(instance == nullptr) {
                instance = new InstanceType;
                add(name, instance);
            }
            return *static_cast<InstanceType*>(instance);
        }